

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sesschan.c
# Opt level: O2

agentfwd * agentfwd_new(ConnectionLayer *cl,char **socketname_out)

{
  agentfwd *ptr;
  char *dirprefix;
  Socket *pSVar1;
  char *socketname;
  char *error;
  
  ptr = (agentfwd *)safemalloc(1,0x18,0);
  ptr->cl = cl;
  (ptr->plug).vt = &agentfwd_plugvt;
  dirprefix = dupprintf("/tmp/%s-agentfwd","psusan");
  error = (char *)0x0;
  socketname = (char *)0x0;
  pSVar1 = platform_make_agent_socket(&ptr->plug,dirprefix,&error,&socketname);
  ptr->socket = pSVar1;
  safefree(dirprefix);
  safefree(error);
  if (ptr->socket == (Socket *)0x0) {
    safefree(ptr);
    safefree(socketname);
    ptr = (agentfwd *)0x0;
  }
  else {
    *socketname_out = socketname;
  }
  return ptr;
}

Assistant:

agentfwd *agentfwd_new(ConnectionLayer *cl, char **socketname_out)
{
    agentfwd *agent = snew(agentfwd);
    agent->cl = cl;
    agent->plug.vt = &agentfwd_plugvt;

    char *dir_prefix = dupprintf("/tmp/%s-agentfwd", appname);
    char *error = NULL, *socketname = NULL;
    agent->socket = platform_make_agent_socket(
        &agent->plug, dir_prefix, &error, &socketname);
    sfree(dir_prefix);
    sfree(error);

    if (!agent->socket) {
        sfree(agent);
        sfree(socketname);
        return NULL;
    }

    *socketname_out = socketname;
    return agent;
}